

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::ContainerEqMatcher<int[10]>::operator()
          (AssertionResult *__return_storage_ptr__,ContainerEqMatcher<int[10]> *this,
          int (*actual) [10])

{
  bool bVar1;
  int *b1;
  int *e1;
  int *b2;
  int *e2;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  int (*local_20) [10];
  int (*actual_local) [10];
  ContainerEqMatcher<int[10]> *this_local;
  
  local_20 = actual;
  actual_local = (int (*) [10])this;
  this_local = (ContainerEqMatcher<int[10]> *)__return_storage_ptr__;
  b1 = std::begin<int_const,10ul>(this->m_expected);
  e1 = std::end<int_const,10ul>(this->m_expected);
  b2 = std::begin<int_const,10ul>(local_20);
  e2 = std::end<int_const,10ul>(local_20);
  bVar1 = Check<int_const*,int_const*>(this,b1,e1,b2,e2);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(begin(m_expected), end(m_expected)
            , begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }